

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.cpp
# Opt level: O1

ShaderCodeVariableDesc *
Diligent::GLDataTypeToShaderCodeVariableDesc
          (ShaderCodeVariableDesc *__return_storage_ptr__,GLenum glDataType)

{
  Uint8 UVar1;
  char *pcVar3;
  SHADER_CODE_VARIABLE_CLASS SVar4;
  SHADER_CODE_BASIC_TYPE SVar5;
  Uint8 UVar6;
  Uint8 UVar2;
  
  __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_UNKNOWN;
  __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_UNKNOWN;
  __return_storage_ptr__->NumRows = '\0';
  __return_storage_ptr__->NumColumns = '\0';
  __return_storage_ptr__->Offset = 0;
  __return_storage_ptr__->ArraySize = 0;
  __return_storage_ptr__->NumMembers = 0;
  __return_storage_ptr__->Name = (char *)0x0;
  __return_storage_ptr__->TypeName = (char *)0x0;
  __return_storage_ptr__->pMembers = (ShaderCodeVariableDesc *)0x0;
  UVar2 = '\x01';
  UVar1 = '\x01';
  if (0x8dc5 < (int)glDataType) {
    if ((int)glDataType < 0x8f46) {
      if (glDataType == 0x8dc6) {
        pcVar3 = "uvec2";
        SVar4 = SHADER_CODE_VARIABLE_CLASS_VECTOR;
        SVar5 = SHADER_CODE_BASIC_TYPE_UINT;
        UVar1 = UVar2;
        goto LAB_0016ed8c;
      }
      if (glDataType == 0x8dc7) {
        pcVar3 = "uvec3";
        UVar6 = '\x03';
      }
      else {
        if (glDataType != 0x8dc8) {
          return __return_storage_ptr__;
        }
        pcVar3 = "uvec4";
        UVar6 = '\x04';
      }
      SVar4 = SHADER_CODE_VARIABLE_CLASS_VECTOR;
      SVar5 = SHADER_CODE_BASIC_TYPE_UINT;
      goto LAB_0016edde;
    }
    if (0x8ffb < (int)glDataType) {
      if (glDataType == 0x8ffc) {
        pcVar3 = "dvec2";
        SVar4 = SHADER_CODE_VARIABLE_CLASS_VECTOR;
        goto LAB_0016ecfd;
      }
      if (glDataType == 0x8ffd) {
        pcVar3 = "dvec3";
        UVar6 = '\x03';
      }
      else {
        if (glDataType != 0x8ffe) {
          return __return_storage_ptr__;
        }
        pcVar3 = "dvec4";
        UVar6 = '\x04';
      }
      SVar4 = SHADER_CODE_VARIABLE_CLASS_VECTOR;
      UVar1 = UVar2;
      goto LAB_0016ed7a;
    }
    switch(glDataType) {
    case 0x8f46:
      pcVar3 = "dmat2";
      UVar2 = '\x02';
      SVar4 = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
LAB_0016ecfd:
      SVar5 = SHADER_CODE_BASIC_TYPE_DOUBLE;
      UVar1 = UVar2;
      goto LAB_0016ed8c;
    case 0x8f47:
      pcVar3 = "dmat3";
      UVar1 = '\x03';
      SVar4 = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
      SVar5 = SHADER_CODE_BASIC_TYPE_DOUBLE;
      goto LAB_0016ed51;
    case 0x8f48:
      pcVar3 = "dmat4";
      SVar5 = SHADER_CODE_BASIC_TYPE_DOUBLE;
      goto LAB_0016ed12;
    case 0x8f49:
      pcVar3 = "dmat2x3";
      UVar6 = '\x03';
      UVar1 = '\x02';
      break;
    case 0x8f4a:
      pcVar3 = "dmat2x4";
      UVar1 = '\x02';
      goto LAB_0016ed9a;
    case 0x8f4b:
      pcVar3 = "dmat3x2";
      UVar6 = '\x02';
      UVar1 = '\x03';
      break;
    case 0x8f4c:
      pcVar3 = "dmat3x4";
      UVar1 = '\x03';
LAB_0016ed9a:
      SVar5 = SHADER_CODE_BASIC_TYPE_DOUBLE;
      goto LAB_0016eda0;
    case 0x8f4d:
      pcVar3 = "dmat4x2";
      UVar6 = '\x02';
      goto LAB_0016edaf;
    case 0x8f4e:
      pcVar3 = "dmat4x3";
      UVar6 = '\x03';
LAB_0016edaf:
      SVar5 = SHADER_CODE_BASIC_TYPE_DOUBLE;
      goto LAB_0016edb5;
    default:
      goto switchD_0016ead6_caseD_8b5d;
    }
    SVar4 = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
LAB_0016ed7a:
    SVar5 = SHADER_CODE_BASIC_TYPE_DOUBLE;
    goto LAB_0016edde;
  }
  SVar5 = SHADER_CODE_BASIC_TYPE_FLOAT;
  switch(glDataType) {
  case 0x8b50:
    pcVar3 = "vec2";
    goto LAB_0016ebe3;
  case 0x8b51:
    pcVar3 = "vec3";
    UVar6 = '\x03';
    goto LAB_0016ecbb;
  case 0x8b52:
    pcVar3 = "vec4";
    UVar6 = '\x04';
    goto LAB_0016ecbb;
  case 0x8b53:
    pcVar3 = "ivec2";
    SVar4 = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    SVar5 = SHADER_CODE_BASIC_TYPE_INT;
    UVar1 = UVar2;
    break;
  case 0x8b54:
    pcVar3 = "ivec3";
    SVar4 = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    SVar5 = SHADER_CODE_BASIC_TYPE_INT;
    UVar1 = UVar2;
    goto LAB_0016ed51;
  case 0x8b55:
    pcVar3 = "ivec4";
    UVar6 = '\x04';
    SVar4 = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    SVar5 = SHADER_CODE_BASIC_TYPE_INT;
    goto LAB_0016edde;
  case 0x8b56:
    pcVar3 = "bool";
    SVar5 = SHADER_CODE_BASIC_TYPE_BOOL;
    goto LAB_0016edd8;
  case 0x8b57:
    pcVar3 = "bvec2";
    SVar5 = SHADER_CODE_BASIC_TYPE_BOOL;
LAB_0016ebe3:
    SVar4 = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    UVar1 = UVar2;
    break;
  case 0x8b58:
    pcVar3 = "bvec3";
    UVar6 = '\x03';
    goto LAB_0016ecb8;
  case 0x8b59:
    pcVar3 = "bvec4";
    UVar6 = '\x04';
LAB_0016ecb8:
    SVar5 = SHADER_CODE_BASIC_TYPE_BOOL;
LAB_0016ecbb:
    SVar4 = SHADER_CODE_VARIABLE_CLASS_VECTOR;
    goto LAB_0016edde;
  case 0x8b5a:
    pcVar3 = "mat2x2";
    SVar4 = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    UVar1 = '\x02';
    break;
  case 0x8b5b:
    pcVar3 = "mat3x3";
    SVar4 = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    UVar1 = '\x03';
LAB_0016ed51:
    UVar6 = '\x03';
    goto LAB_0016edde;
  case 0x8b5c:
    pcVar3 = "mat4x4";
LAB_0016ed12:
    UVar1 = '\x04';
    goto LAB_0016eda0;
  case 0x8b5d:
  case 0x8b5e:
  case 0x8b5f:
  case 0x8b60:
  case 0x8b61:
  case 0x8b62:
  case 0x8b63:
  case 0x8b64:
    goto switchD_0016ead6_caseD_8b5d;
  case 0x8b65:
    pcVar3 = "dmat2x3";
    UVar6 = '\x03';
    UVar1 = '\x02';
    goto LAB_0016eca6;
  case 0x8b66:
    pcVar3 = "mat2x4";
    UVar1 = '\x02';
    goto LAB_0016eda0;
  case 0x8b67:
    pcVar3 = "dmat3x2";
    UVar6 = '\x02';
    UVar1 = '\x03';
LAB_0016eca6:
    pcVar3 = pcVar3 + 1;
    SVar4 = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    goto LAB_0016edde;
  case 0x8b68:
    pcVar3 = "mat3x4";
    UVar1 = '\x03';
LAB_0016eda0:
    SVar4 = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    UVar6 = '\x04';
    goto LAB_0016edde;
  case 0x8b69:
    pcVar3 = "mat4x2";
    UVar6 = '\x02';
    goto LAB_0016edb5;
  case 0x8b6a:
    pcVar3 = "mat4x3";
    UVar6 = '\x03';
LAB_0016edb5:
    SVar4 = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
    UVar1 = '\x04';
    goto LAB_0016edde;
  default:
    switch(glDataType) {
    case 0x1404:
      pcVar3 = "int";
      SVar5 = SHADER_CODE_BASIC_TYPE_INT;
      break;
    case 0x1405:
      pcVar3 = "uint";
      SVar5 = SHADER_CODE_BASIC_TYPE_UINT;
      break;
    case 0x1406:
      pcVar3 = "float";
      break;
    default:
      goto switchD_0016ead6_caseD_8b5d;
    case 0x140a:
      pcVar3 = "double";
      SVar5 = SHADER_CODE_BASIC_TYPE_DOUBLE;
    }
LAB_0016edd8:
    SVar4 = SHADER_CODE_VARIABLE_CLASS_SCALAR;
    UVar6 = '\x01';
    goto LAB_0016edde;
  }
LAB_0016ed8c:
  UVar6 = '\x02';
LAB_0016edde:
  __return_storage_ptr__->BasicType = SVar5;
  __return_storage_ptr__->Class = SVar4;
  __return_storage_ptr__->NumColumns = UVar1;
  __return_storage_ptr__->NumRows = UVar6;
  __return_storage_ptr__->TypeName = pcVar3;
switchD_0016ead6_caseD_8b5d:
  return __return_storage_ptr__;
}

Assistant:

ShaderCodeVariableDesc GLDataTypeToShaderCodeVariableDesc(GLenum glDataType)
{
    ShaderCodeVariableDesc Desc;
    switch (glDataType)
    {
        case GL_FLOAT:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_SCALAR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 1;
            Desc.TypeName   = "float";
            break;

        case GL_FLOAT_VEC2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 2;
            Desc.TypeName   = "vec2";
            break;

        case GL_FLOAT_VEC3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 3;
            Desc.TypeName   = "vec3";
            break;

        case GL_FLOAT_VEC4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 4;
            Desc.TypeName   = "vec4";
            break;

        case GL_DOUBLE:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_SCALAR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 1;
            Desc.TypeName   = "double";
            break;

        case GL_DOUBLE_VEC2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 2;
            Desc.TypeName   = "dvec2";
            break;

        case GL_DOUBLE_VEC3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 3;
            Desc.TypeName   = "dvec3";
            break;

        case GL_DOUBLE_VEC4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 4;
            Desc.TypeName   = "dvec4";
            break;

        case GL_INT:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_INT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_SCALAR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 1;
            Desc.TypeName   = "int";
            break;

        case GL_INT_VEC2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_INT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 2;
            Desc.TypeName   = "ivec2";
            break;

        case GL_INT_VEC3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_INT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 3;
            Desc.TypeName   = "ivec3";
            break;

        case GL_INT_VEC4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_INT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 4;
            Desc.TypeName   = "ivec4";
            break;

        case GL_UNSIGNED_INT:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_UINT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_SCALAR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 1;
            Desc.TypeName   = "uint";
            break;

        case GL_UNSIGNED_INT_VEC2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_UINT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 2;
            Desc.TypeName   = "uvec2";
            break;

        case GL_UNSIGNED_INT_VEC3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_UINT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 3;
            Desc.TypeName   = "uvec3";
            break;

        case GL_UNSIGNED_INT_VEC4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_UINT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 4;
            Desc.TypeName   = "uvec4";
            break;

        case GL_BOOL:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_BOOL;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_SCALAR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 1;
            Desc.TypeName   = "bool";
            break;

        case GL_BOOL_VEC2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_BOOL;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 2;
            Desc.TypeName   = "bvec2";
            break;

        case GL_BOOL_VEC3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_BOOL;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 3;
            Desc.TypeName   = "bvec3";
            break;

        case GL_BOOL_VEC4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_BOOL;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 4;
            Desc.TypeName   = "bvec4";
            break;

        case GL_FLOAT_MAT2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 2;
            Desc.NumRows    = 2;
            Desc.TypeName   = "mat2x2";
            break;

        case GL_FLOAT_MAT3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 3;
            Desc.NumRows    = 3;
            Desc.TypeName   = "mat3x3";
            break;

        case GL_FLOAT_MAT4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 4;
            Desc.NumRows    = 4;
            Desc.TypeName   = "mat4x4";
            break;

        case GL_FLOAT_MAT2x3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 2;
            Desc.NumRows    = 3;
            Desc.TypeName   = "mat2x3";
            break;

        case GL_FLOAT_MAT2x4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 2;
            Desc.NumRows    = 4;
            Desc.TypeName   = "mat2x4";
            break;

        case GL_FLOAT_MAT3x2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 3;
            Desc.NumRows    = 2;
            Desc.TypeName   = "mat3x2";
            break;

        case GL_FLOAT_MAT3x4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 3;
            Desc.NumRows    = 4;
            Desc.TypeName   = "mat3x4";
            break;

        case GL_FLOAT_MAT4x2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 4;
            Desc.NumRows    = 2;
            Desc.TypeName   = "mat4x2";
            break;

        case GL_FLOAT_MAT4x3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 4;
            Desc.NumRows    = 3;
            Desc.TypeName   = "mat4x3";
            break;

        case GL_DOUBLE_MAT2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 2;
            Desc.NumRows    = 2;
            Desc.TypeName   = "dmat2";
            break;

        case GL_DOUBLE_MAT3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 3;
            Desc.NumRows    = 3;
            Desc.TypeName   = "dmat3";
            break;

        case GL_DOUBLE_MAT4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 4;
            Desc.NumRows    = 4;
            Desc.TypeName   = "dmat4";
            break;

        case GL_DOUBLE_MAT2x3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 2;
            Desc.NumRows    = 3;
            Desc.TypeName   = "dmat2x3";
            break;

        case GL_DOUBLE_MAT2x4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 2;
            Desc.NumRows    = 4;
            Desc.TypeName   = "dmat2x4";
            break;

        case GL_DOUBLE_MAT3x2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 3;
            Desc.NumRows    = 2;
            Desc.TypeName   = "dmat3x2";
            break;

        case GL_DOUBLE_MAT3x4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 3;
            Desc.NumRows    = 4;
            Desc.TypeName   = "dmat3x4";
            break;

        case GL_DOUBLE_MAT4x2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 4;
            Desc.NumRows    = 2;
            Desc.TypeName   = "dmat4x2";
            break;

        case GL_DOUBLE_MAT4x3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 4;
            Desc.NumRows    = 3;
            Desc.TypeName   = "dmat4x3";
            break;

        default:
            // Unknown type - skip
            break;
    }

    return Desc;
}